

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall soplex::SPxScaler<double>::minAbsColscale(SPxScaler<double> *this)

{
  DataArray<int> *this_00;
  int iVar1;
  double *pdVar2;
  long in_RDI;
  Real RVar3;
  int i;
  double mini;
  DataArray<int> *colscaleExp;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  int n;
  undefined8 local_18;
  
  this_00 = *(DataArray<int> **)(in_RDI + 0x10);
  pdVar2 = (double *)infinity();
  local_18 = *pdVar2;
  iVar4 = 0;
  while( true ) {
    n = iVar4;
    iVar1 = DataArray<int>::size(this_00);
    if (iVar1 <= iVar4) break;
    DataArray<int>::operator[](this_00,n);
    RVar3 = spxLdexp((Real)CONCAT44(n,iVar4),in_stack_ffffffffffffffdc);
    RVar3 = spxAbs<double>(RVar3);
    if (RVar3 < local_18) {
      DataArray<int>::operator[](this_00,n);
      RVar3 = spxLdexp((Real)CONCAT44(n,iVar4),in_stack_ffffffffffffffdc);
      local_18 = spxAbs<double>(RVar3);
    }
    iVar4 = n + 1;
  }
  return local_18;
}

Assistant:

R SPxScaler<R>::minAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R mini = R(infinity);

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) < mini)
         mini = spxAbs(spxLdexp(1.0, colscaleExp[i]));

   return mini;
}